

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trackableobject.h
# Opt level: O2

void __thiscall Trackableobject::append(Trackableobject *this,centroid c,rect *r)

{
  queue<std::pair<float,_float>,_std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
  *this_00;
  queue<std::pair<float,_float>,_std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
  *this_01;
  int iVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int local_68;
  int iStack_64;
  pair<centroid,_rect> local_48;
  
  sVar4 = std::deque<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>::size
                    ((deque<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>
                      *)this);
  if (sVar4 == (long)this->maxRemenbers) {
    std::deque<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>::pop_front
              ((deque<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_> *)this
              );
  }
  this_00 = &this->speeds;
  sVar4 = std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::size
                    (&this_00->c);
  if (sVar4 == (long)this->maxRemenbers) {
    std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::pop_front
              (&this_00->c);
  }
  this_01 = &this->accelerations;
  sVar4 = std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::size
                    (&this_01->c);
  if (sVar4 == (long)this->maxRemenbers) {
    std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::pop_front
              (&this_01->c);
  }
  local_48.second.x1 = r->x1;
  local_48.second.y1 = r->y1;
  local_48.second.x2 = r->x2;
  local_48.second.y2 = r->y2;
  local_48.first = c;
  std::deque<std::pair<centroid,rect>,std::allocator<std::pair<centroid,rect>>>::
  emplace_back<std::pair<centroid,rect>>
            ((deque<std::pair<centroid,rect>,std::allocator<std::pair<centroid,rect>>> *)this,
             &local_48);
  local_68 = c.x;
  iStack_64 = c.y;
  fVar5 = (float)local_68;
  fVar7 = (float)iStack_64;
  fVar6 = fVar5 - (this->lastlocation).first;
  fVar8 = fVar7 - (this->lastlocation).second;
  local_48.first.y = fVar8;
  local_48.first.x = fVar6;
  std::deque<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
  emplace_back<std::pair<float,float>>
            ((deque<std::pair<float,float>,std::allocator<std::pair<float,float>>> *)this_00,
             (pair<float,_float> *)&local_48);
  (this->lastlocation).first = fVar5;
  (this->lastlocation).second = fVar7;
  (this->lastspeed).first = fVar6;
  (this->lastspeed).second = fVar8;
  iVar1 = r->y1;
  iVar2 = r->x2;
  iVar3 = r->y2;
  (this->predRect).x1 = (int)((float)r->x1 + fVar6);
  (this->predRect).y1 = (int)((float)iVar1 + fVar8);
  (this->predRect).x2 = (int)((float)iVar2 + fVar6);
  (this->predRect).y2 = (int)((float)iVar3 + fVar8);
  local_48.first.x = (fVar5 - fVar5) - fVar6;
  local_48.first.y = (fVar7 - fVar7) - fVar8;
  std::deque<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
  emplace_back<std::pair<float,float>>
            ((deque<std::pair<float,float>,std::allocator<std::pair<float,float>>> *)this_01,
             (pair<float,_float> *)&local_48);
  return;
}

Assistant:

void append(centroid c, rect r) {
		if(this->locations.size()==maxRemenbers){
			this->locations.pop();
		}
		if(this->speeds.size()==maxRemenbers){
			this->speeds.pop();
		}
		if(this->accelerations.size()==maxRemenbers){
			this->accelerations.pop();
		}
		this->locations.push(std::pair<centroid, rect>(c, r));

		// ----------------about the speeds and accelerations------------------------
		{
			//std::pair<float, float> lastlocation = speeds.back();
			float sX = c.x - lastlocation.first;
			float sY = c.y - lastlocation.second;
			
			speeds.push(std::pair<float, float>(sX, sY));

			lastlocation = std::pair<float, float>(c.x, c.y);
			lastspeed = std::pair<float, float>(sX, sY);

			predRect = rect(r.x1 + sX, r.y1 + sY, 
							r.x2 + sX, r.y2 + sY);
		}

		{

			float sX = c.x - lastlocation.first;
			float sY = c.y - lastlocation.second;

			float aX = sX - lastspeed.first;
			float aY = sY - lastspeed.second;

			accelerations.push(std::pair<float, float>(aX, aY));
		}
	}